

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMI_DH_PCR_Unmarshal(TPMI_DH_PCR *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPM_RC TVar1;
  
  TVar1 = UINT32_Unmarshal(target,buffer,size);
  if (TVar1 == 0) {
    if (*target == 0x40000007) {
      TVar1 = 0x84;
      if (flag != 0) {
        TVar1 = 0;
      }
    }
    else {
      TVar1 = 0x84;
      if (*target < 0x18) {
        TVar1 = 0;
      }
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMI_DH_PCR_Unmarshal(TPMI_DH_PCR *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
   if (*target == TPM_RH_NULL) {
        if(flag)
            return TPM_RC_SUCCESS;
        else
            return TPM_RC_VALUE;
    }
    if(*target > PCR_LAST)
    return TPM_RC_VALUE;
    return TPM_RC_SUCCESS;
}